

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_perform_rcpt_to(connectdata *conn)

{
  void *pvVar1;
  undefined1 local_58 [8];
  hostname host;
  char *address;
  SMTP *smtp;
  Curl_easy *data;
  CURLcode result;
  connectdata *conn_local;
  
  pvVar1 = (conn->data->req).protop;
  host.dispname = (char *)0x0;
  memset(local_58,0,0x20);
  conn_local._4_4_ =
       smtp_parse_address(conn,(char *)**(undefined8 **)((long)pvVar1 + 0x10),&host.dispname,
                          (hostname *)local_58);
  if (conn_local._4_4_ == CURLE_OK) {
    if (host.encalloc == (char *)0x0) {
      data._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"RCPT TO:<%s>",host.dispname);
    }
    else {
      data._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"RCPT TO:<%s@%s>",host.dispname,
                                 host.encalloc);
    }
    Curl_free_idnconverted_hostname((hostname *)local_58);
    (*Curl_cfree)(host.dispname);
    if (data._4_4_ == CURLE_OK) {
      state(conn,SMTP_RCPT);
    }
    conn_local._4_4_ = data._4_4_;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode smtp_perform_rcpt_to(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct SMTP *smtp = data->req.protop;
  char *address = NULL;
  struct hostname host = { NULL, NULL, NULL, NULL };

  /* Parse the recipient mailbox into the local address and host name parts,
     converting the host name to an IDN A-label if necessary */
  result = smtp_parse_address(conn, smtp->rcpt->data,
                              &address, &host);
  if(result)
    return result;

  /* Send the RCPT TO command */
  if(host.name)
    result = Curl_pp_sendf(&conn->proto.smtpc.pp, "RCPT TO:<%s@%s>", address,
                           host.name);
  else
    /* An invalid mailbox was provided but we'll simply let the server worry
       about that and reply with a 501 error */
    result = Curl_pp_sendf(&conn->proto.smtpc.pp, "RCPT TO:<%s>", address);

  Curl_free_idnconverted_hostname(&host);
  free(address);

  if(!result)
    state(conn, SMTP_RCPT);

  return result;
}